

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

MPP_RET mpp_enc_get_pskip_mode(Mpp *mpp,EncAsyncTaskInfo *task,MppPskipMode *skip_mode)

{
  MppFrame frame;
  ulong uVar1;
  RK_S32 RVar2;
  MPP_RET extraout_EAX;
  MppMeta meta;
  ulong uVar3;
  
  skip_mode->pskip_is_ref = 0;
  skip_mode->pskip_is_non_ref = 0;
  frame = (task->task).frame;
  mpp->mEosTask = frame;
  RVar2 = mpp_frame_has_meta(frame);
  if (RVar2 != 0) {
    meta = mpp_frame_get_meta(mpp->mEosTask);
    if (meta != (MppMeta)0x0) {
      mpp_meta_get_s32(meta,KEY_INPUT_PSKIP,&skip_mode->pskip_is_ref);
      mpp_meta_get_s32(meta,KEY_INPUT_PSKIP_NON_REF,&skip_mode->pskip_is_non_ref);
    }
  }
  if (skip_mode->pskip_is_non_ref == 1 && skip_mode->pskip_is_ref == 1) {
    _mpp_log_l(2,"mpp_enc",
               "task %d, Don\'t cfg pskip frame to be both a ref and non-ref at the same time",
               (char *)0x0);
    return extraout_EAX;
  }
  uVar3 = (ulong)(skip_mode->pskip_is_non_ref & 1) << 0x24;
  uVar1 = (task->rc).frm.val;
  (task->rc).frm.val = uVar1 & 0xffffffefffffffff | uVar3;
  (task->rc).frm.val =
       uVar1 & 0xffffffcfffffffff | uVar3 | (ulong)(skip_mode->pskip_is_ref & 1) << 0x25;
  return MPP_OK;
}

Assistant:

static MPP_RET mpp_enc_get_pskip_mode(Mpp *mpp, EncAsyncTaskInfo *task, MppPskipMode *skip_mode)
{
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    EncRcTask *rc_task = &task->rc;
    EncFrmStatus *frm = &rc_task->frm;
    HalEncTask *hal_task = &task->task;
    MPP_RET ret = MPP_OK;

    skip_mode->pskip_is_ref = 0;
    skip_mode->pskip_is_non_ref = 0;
    enc->frame = hal_task->frame;

    if (mpp_frame_has_meta(enc->frame)) {
        MppMeta frm_meta = mpp_frame_get_meta(enc->frame);
        if (frm_meta) {
            mpp_meta_get_s32(frm_meta, KEY_INPUT_PSKIP, &skip_mode->pskip_is_ref);
            mpp_meta_get_s32(frm_meta, KEY_INPUT_PSKIP_NON_REF, &skip_mode->pskip_is_non_ref);
        }
    }

    if (skip_mode->pskip_is_ref == 1 && skip_mode->pskip_is_non_ref == 1) {
        mpp_err("task %d, Don't cfg pskip frame to be both a ref and non-ref at the same time");
        ret = MPP_NOK;
    } else {
        frm->force_pskip = skip_mode->pskip_is_non_ref;
        frm->force_pskip_is_ref = skip_mode->pskip_is_ref;
        ret = MPP_OK;
    }

    return ret;
}